

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  bool bVar1;
  char *pcVar2;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  Token *local_18;
  Token *this_local;
  
  local_18 = this;
  this_local = (Token *)__return_storage_ptr__;
  bVar1 = IsTokenTypeBare(this->token_type_);
  if (bVar1) {
    pcVar2 = GetTokenTypeName(this->token_type_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = HasLiteral(this);
    if (bVar1) {
      string_view::to_string_abi_cxx11_(__return_storage_ptr__,&(this->field_2).literal_.text);
    }
    else {
      bVar1 = HasOpcode(this);
      if (bVar1) {
        pcVar2 = Opcode::GetName(&(this->field_2).opcode_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_1a);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a);
      }
      else {
        bVar1 = HasText(this);
        if (bVar1) {
          string_view::to_string_abi_cxx11_(__return_storage_ptr__,&(this->field_2).text_);
        }
        else {
          bVar1 = HasType(this);
          if (!bVar1) {
            __assert_fail("HasType()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.cc"
                          ,0x53,"std::string wabt::Token::to_string() const");
          }
          pcVar2 = Type::GetName(&(this->field_2).type_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_1b);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return literal_.text.to_string();
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return text_.to_string();
  } else {
    assert(HasType());
    return type_.GetName();
  }
}